

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.h
# Opt level: O0

string * __thiscall
sockpp::unix_address::path_abi_cxx11_(string *__return_storage_ptr__,unix_address *this)

{
  size_t sVar1;
  char *__string;
  allocator local_19;
  unix_address *local_18;
  unix_address *this_local;
  
  __string = (this->addr_).sun_path;
  local_18 = this;
  this_local = (unix_address *)__return_storage_ptr__;
  sVar1 = strnlen(__string,0x6c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,__string,sVar1,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

string path() const {
        // Remember, if len==MAX, there's no NUL terminator
        return string(addr_.sun_path, strnlen(addr_.sun_path, MAX_PATH_NAME));
    }